

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * fts3HashMalloc(sqlite3_int64 n)

{
  void *__s;
  void *p;
  sqlite3_int64 n_local;
  
  __s = sqlite3_malloc64(n);
  if (__s != (void *)0x0) {
    memset(__s,0,n);
  }
  return __s;
}

Assistant:

static void *fts3HashMalloc(sqlite3_int64 n){
  void *p = sqlite3_malloc64(n);
  if( p ){
    memset(p, 0, n);
  }
  return p;
}